

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O0

bool __thiscall
ON_SubDQuadNeighborhood::Set(ON_SubDQuadNeighborhood *this,ON_SubDFace *center_quad_face)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ON_SubDEdge *this_00;
  ON_SubDFace *pOVar4;
  ON_SubDVertex *pOVar5;
  ON_SubDVertex *pOVar6;
  ON_SubDFace *pOVar7;
  ON_SubDEdgePtr OVar8;
  uchar local_258;
  StopAt stop_at_1;
  StopAt stop_at;
  ON__UINT_PTR eptr_1;
  ON_SubDVertex *v [2];
  ON_SubDEdge *e [2];
  uint uStack_1bc;
  bool b4EdgedCorner;
  uint qfei3;
  uint qfei_3;
  ON_SubDVertex *outer_vertex [12];
  ON_SubDFace *corner_faces [4];
  undefined1 local_130 [8];
  ON_SubDSectorIterator sit1;
  ON_SubDSectorIterator sit0;
  ON_SubDFace *pOStack_98;
  uint qfei_2;
  ON_SubDFace *qf_nbr_face [4];
  ON__UINT_PTR ev1;
  uint qfei_1;
  ON_SubDEdge *edge;
  ON__UINT_PTR eptr;
  byte abStack_50 [4];
  uint qfei;
  bool bIsCreaseEdge [4];
  bool bIsDartVertex [4];
  ON_SubDVertex *qf_vertex [4];
  ON_SubDFace *center_quad_face_local;
  ON_SubDQuadNeighborhood *this_local;
  
  Clear(this,false);
  if (center_quad_face == (ON_SubDFace *)0x0) {
    this_local._7_1_ = true;
  }
  else if (center_quad_face->m_edge_count == 4) {
    for (eptr._4_4_ = 0; eptr._4_4_ < 4; eptr._4_4_ = eptr._4_4_ + 1) {
      uVar1 = center_quad_face->m_edge4[eptr._4_4_].m_ptr;
      this_00 = (ON_SubDEdge *)(uVar1 & 0xfffffffffffffff8);
      if (this_00 == (ON_SubDEdge *)0x0) {
        ON_SubDIncrementErrorCount();
        return false;
      }
      if (this_00->m_vertex[0] == (ON_SubDVertex *)0x0) {
        ON_SubDIncrementErrorCount();
        return false;
      }
      if (this_00->m_vertex[1] == (ON_SubDVertex *)0x0) {
        ON_SubDIncrementErrorCount();
        return false;
      }
      bVar2 = ON_SubDEdge::IsCrease(this_00);
      abStack_50[eptr._4_4_] = bVar2;
      this->m_center_edges[eptr._4_4_] = this_00;
      *(ON_SubDVertex **)(bIsCreaseEdge + (ulong)eptr._4_4_ * 8) = this_00->m_vertex[uVar1 & 1];
      bVar2 = ON_SubDVertex::IsDart(*(ON_SubDVertex **)(bIsCreaseEdge + (ulong)eptr._4_4_ * 8));
      bIsCreaseEdge[(ulong)eptr._4_4_ - 4] = bVar2;
    }
    for (ev1._4_4_ = 0; ev1._4_4_ < 4; ev1._4_4_ = ev1._4_4_ + 1) {
      qf_nbr_face[3] = (ON_SubDFace *)(1 - (center_quad_face->m_edge4[ev1._4_4_].m_ptr & 1));
      if (*(long *)(bIsCreaseEdge + (ulong)(ev1._4_4_ + 1 & 3) * 8) !=
          *(long *)((long)this->m_center_edges[ev1._4_4_] + (long)qf_nbr_face[3] * 8 + 0x80)) {
        ON_SubDIncrementErrorCount();
        return false;
      }
    }
    memset(&stack0xffffffffffffff68,0,0x20);
    for (sit0._68_4_ = 0; (uint)sit0._68_4_ < 4; sit0._68_4_ = sit0._68_4_ + 1) {
      if ((((abStack_50[(uint)sit0._68_4_] & 1) == 0) ||
          ((bIsCreaseEdge[(ulong)(uint)sit0._68_4_ - 4] & 1U) != 0)) ||
         ((bIsCreaseEdge[(ulong)(sit0._68_4_ + 1 & 3) - 4] & 1U) != 0)) {
        pOVar4 = ON_SubDEdge::NeighborFace
                           (this->m_center_edges[(uint)sit0._68_4_],center_quad_face,false);
        qf_nbr_face[(ulong)(uint)sit0._68_4_ - 1] = pOVar4;
      }
      else {
        this->m_bBoundaryCrease[(uint)sit0._68_4_] = true;
        this->m_boundary_crease_count = this->m_boundary_crease_count + '\x01';
      }
    }
    ON_SubDSectorIterator::ON_SubDSectorIterator
              ((ON_SubDSectorIterator *)&sit1.m_current_ring_index);
    ON_SubDSectorIterator::ON_SubDSectorIterator((ON_SubDSectorIterator *)local_130);
    this->m_face_grid[1][1] = center_quad_face;
    this->m_face_grid[1][0] = pOStack_98;
    this->m_face_grid[2][1] = qf_nbr_face[0];
    this->m_face_grid[1][2] = qf_nbr_face[1];
    this->m_face_grid[0][1] = qf_nbr_face[2];
    this->m_vertex_grid[1][1] = _bIsCreaseEdge;
    this->m_vertex_grid[2][1] = qf_vertex[0];
    this->m_vertex_grid[2][2] = qf_vertex[1];
    this->m_vertex_grid[1][2] = qf_vertex[2];
    memset(outer_vertex + 0xb,0,0x20);
    memset(&qfei3,0,0x60);
    for (uStack_1bc = 0; uStack_1bc < 4; uStack_1bc = uStack_1bc + 1) {
      uVar3 = uStack_1bc + 3 & 3;
      if ((qf_nbr_face[(ulong)uStack_1bc - 1] != (ON_SubDFace *)0x0) ||
         (qf_nbr_face[(ulong)uVar3 - 1] != (ON_SubDFace *)0x0)) {
        pOVar5 = ON_SubDSectorIterator::Initialize
                           ((ON_SubDSectorIterator *)&sit1.m_current_ring_index,center_quad_face,0,
                            uStack_1bc);
        if (pOVar5 == (ON_SubDVertex *)0x0) {
          ON_SubDIncrementErrorCount();
          return false;
        }
        pOVar5 = *(ON_SubDVertex **)(bIsCreaseEdge + (ulong)uStack_1bc * 8);
        pOVar6 = ON_SubDSectorIterator::CenterVertex
                           ((ON_SubDSectorIterator *)&sit1.m_current_ring_index);
        if (pOVar5 != pOVar6) {
          ON_SubDIncrementErrorCount();
          return false;
        }
        memcpy(local_130,&sit1.m_current_ring_index,0x44);
        bVar2 = false;
        if (*(short *)(*(long *)(bIsCreaseEdge + (ulong)uStack_1bc * 8) + 0x68) == 4) {
          bVar2 = 2 < *(ushort *)(*(long *)(bIsCreaseEdge + (ulong)uStack_1bc * 8) + 0x6a);
        }
        memset(v + 1,0,0x10);
        memset(&eptr_1,0,0x10);
        if (qf_nbr_face[(ulong)uStack_1bc - 1] == (ON_SubDFace *)0x0) {
LAB_008fd905:
          if ((e[0] == (ON_SubDEdge *)0x0) && (qf_nbr_face[(ulong)uVar3 - 1] != (ON_SubDFace *)0x0))
          {
            pOVar4 = qf_nbr_face[(ulong)uVar3 - 1];
            pOVar7 = ON_SubDSectorIterator::NextFace((ON_SubDSectorIterator *)local_130,Boundary);
            if (pOVar4 != pOVar7) {
              ON_SubDIncrementErrorCount();
              return false;
            }
            OVar8 = ON_SubDSectorIterator::CurrentEdgePtr((ON_SubDSectorIterator *)local_130,1);
            e[0] = (ON_SubDEdge *)(OVar8.m_ptr & 0xfffffffffffffff8);
            if (e[0] == (ON_SubDEdge *)0x0) {
              ON_SubDIncrementErrorCount();
              return false;
            }
            v[0] = *(ON_SubDVertex **)((long)e[0] + (1 - (OVar8.m_ptr & 1)) * 8 + 0x80);
            if (v[0] == (ON_SubDVertex *)0x0) {
              ON_SubDIncrementErrorCount();
              return false;
            }
            if ((bVar2) && (outer_vertex[(ulong)uStack_1bc + 0xb] == (ON_SubDVertex *)0x0)) {
              pOVar5 = (ON_SubDVertex *)
                       ON_SubDSectorIterator::NextFace
                                 ((ON_SubDSectorIterator *)local_130,
                                  (bIsCreaseEdge[(ulong)uVar3 - 4] & 1U) == 0);
              outer_vertex[(ulong)uStack_1bc + 0xb] = pOVar5;
              if ((outer_vertex[(ulong)uStack_1bc + 0xb] != (ON_SubDVertex *)0x0) &&
                 (v[1] == (ON_SubDVertex *)0x0)) {
                OVar8 = ON_SubDSectorIterator::CurrentEdgePtr((ON_SubDSectorIterator *)local_130,1);
                v[1] = (ON_SubDVertex *)(OVar8.m_ptr & 0xfffffffffffffff8);
                if (v[1] == (ON_SubDVertex *)0x0) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
                eptr_1 = *(ON__UINT_PTR *)((long)v[1] + (1 - (OVar8.m_ptr & 1)) * 8 + 0x80);
                if (eptr_1 == 0) {
                  ON_SubDIncrementErrorCount();
                  return false;
                }
              }
            }
          }
        }
        else {
          pOVar4 = qf_nbr_face[(ulong)uStack_1bc - 1];
          pOVar7 = ON_SubDSectorIterator::PrevFace
                             ((ON_SubDSectorIterator *)&sit1.m_current_ring_index,Boundary);
          if (pOVar4 != pOVar7) {
            ON_SubDIncrementErrorCount();
            return false;
          }
          OVar8 = ON_SubDSectorIterator::CurrentEdgePtr
                            ((ON_SubDSectorIterator *)&sit1.m_current_ring_index,0);
          v[1] = (ON_SubDVertex *)(OVar8.m_ptr & 0xfffffffffffffff8);
          if (v[1] == (ON_SubDVertex *)0x0) {
            ON_SubDIncrementErrorCount();
            return false;
          }
          eptr_1 = *(ON__UINT_PTR *)((long)v[1] + (1 - (OVar8.m_ptr & 1)) * 8 + 0x80);
          if (eptr_1 == 0) {
            ON_SubDIncrementErrorCount();
            return false;
          }
          if (!bVar2) goto LAB_008fd905;
          pOVar5 = (ON_SubDVertex *)
                   ON_SubDSectorIterator::PrevFace
                             ((ON_SubDSectorIterator *)&sit1.m_current_ring_index,
                              (bIsCreaseEdge[(ulong)uStack_1bc - 4] & 1U) == 0);
          outer_vertex[(ulong)uStack_1bc + 0xb] = pOVar5;
          if (outer_vertex[(ulong)uStack_1bc + 0xb] == (ON_SubDVertex *)0x0) goto LAB_008fd905;
          OVar8 = ON_SubDSectorIterator::CurrentEdgePtr
                            ((ON_SubDSectorIterator *)&sit1.m_current_ring_index,0);
          e[0] = (ON_SubDEdge *)(OVar8.m_ptr & 0xfffffffffffffff8);
          if (e[0] == (ON_SubDEdge *)0x0) {
            ON_SubDIncrementErrorCount();
            return false;
          }
          v[0] = *(ON_SubDVertex **)((long)e[0] + (1 - (OVar8.m_ptr & 1)) * 8 + 0x80);
          if (v[0] == (ON_SubDVertex *)0x0) {
            ON_SubDIncrementErrorCount();
            return false;
          }
        }
        if (outer_vertex[(ulong)uStack_1bc + 0xb] != (ON_SubDVertex *)0x0) {
          pOVar5 = ON_SubDFace::QuadOppositeVertex
                             ((ON_SubDFace *)outer_vertex[(ulong)uStack_1bc + 0xb],
                              *(ON_SubDVertex **)(bIsCreaseEdge + (ulong)uStack_1bc * 8));
          *(ON_SubDVertex **)(&qfei3 + (ulong)(uStack_1bc * 3) * 2) = pOVar5;
        }
        if (v[1] != (ON_SubDVertex *)0x0) {
          this->m_edge_grid[uStack_1bc][0] = (ON_SubDEdge *)v[1];
          *(ON__UINT_PTR *)(&qfei3 + (ulong)(uStack_1bc * 3 + 1) * 2) = eptr_1;
        }
        if (e[0] != (ON_SubDEdge *)0x0) {
          this->m_edge_grid[uVar3][1] = e[0];
          *(ON_SubDVertex **)(&qfei3 + ((ulong)(uStack_1bc * 3 + 0xb) % 0xc) * 2) = v[0];
        }
      }
    }
    this->m_face_grid[0][0] = (ON_SubDFace *)outer_vertex[0xb];
    this->m_face_grid[2][0] = corner_faces[0];
    this->m_face_grid[2][2] = corner_faces[1];
    this->m_face_grid[0][2] = corner_faces[2];
    this->m_vertex_grid[0][0] = _qfei3;
    this->m_vertex_grid[1][0] = outer_vertex[0];
    this->m_vertex_grid[2][0] = outer_vertex[1];
    this->m_vertex_grid[3][0] = outer_vertex[2];
    this->m_vertex_grid[3][1] = outer_vertex[3];
    this->m_vertex_grid[3][2] = outer_vertex[4];
    this->m_vertex_grid[3][3] = outer_vertex[5];
    this->m_vertex_grid[2][3] = outer_vertex[6];
    this->m_vertex_grid[1][3] = outer_vertex[7];
    this->m_vertex_grid[0][3] = outer_vertex[8];
    this->m_vertex_grid[0][2] = outer_vertex[9];
    this->m_vertex_grid[0][1] = outer_vertex[10];
    if (center_quad_face->m_level_zero_face_id == 0) {
      local_258 = '\0';
    }
    else {
      uVar3 = ON_SubDComponentBase::SubdivisionLevel(&center_quad_face->super_ON_SubDComponentBase);
      local_258 = (uchar)uVar3;
    }
    this->m_initial_subdivision_level = local_258;
    this->m_current_subdivision_level = this->m_initial_subdivision_level;
    SetPatchStatus(this,0);
    this_local._7_1_ = true;
  }
  else {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDQuadNeighborhood::Set(
  const ON_SubDFace* center_quad_face
  )
{
  ON_SubDQuadNeighborhood::Clear(this, false);

  if (nullptr == center_quad_face)
    return true;

  if (4 != center_quad_face->m_edge_count)
    return ON_SUBD_RETURN_ERROR(false);

  const ON_SubDVertex* qf_vertex[4];
  bool bIsDartVertex[4];
  bool bIsCreaseEdge[4];
  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    const ON__UINT_PTR eptr = center_quad_face->m_edge4[qfei].m_ptr;
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr);
    if (nullptr == edge)
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == edge->m_vertex[0])
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == edge->m_vertex[1])
      return ON_SUBD_RETURN_ERROR(false);

    bIsCreaseEdge[qfei] = edge->IsCrease();

    m_center_edges[qfei] = edge;

    qf_vertex[qfei] = edge->m_vertex[ON_SUBD_EDGE_DIRECTION(eptr)];
    
    bIsDartVertex[qfei] = qf_vertex[qfei]->IsDart();
  }

  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    ON__UINT_PTR ev1 = 1-ON_SUBD_EDGE_DIRECTION(center_quad_face->m_edge4[qfei].m_ptr);
    if ( qf_vertex[(qfei+1)%4] != m_center_edges[qfei]->m_vertex[ev1] )
      return ON_SUBD_RETURN_ERROR(false);
  }
  
  const ON_SubDFace* qf_nbr_face[4] = {};
  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    if (bIsCreaseEdge[qfei] && false == bIsDartVertex[qfei] && false == bIsDartVertex[(qfei+1)%4])
    {
      m_bBoundaryCrease[qfei] = true;
      m_boundary_crease_count++;
      continue;
    }
    qf_nbr_face[qfei] = m_center_edges[qfei]->NeighborFace(center_quad_face, false);
  }

  ON_SubDSectorIterator sit0, sit1;

  m_face_grid[1][1] = center_quad_face;
  m_face_grid[1][0] = qf_nbr_face[0];
  m_face_grid[2][1] = qf_nbr_face[1];
  m_face_grid[1][2] = qf_nbr_face[2];
  m_face_grid[0][1] = qf_nbr_face[3];

  m_vertex_grid[1][1] = qf_vertex[0];
  m_vertex_grid[2][1] = qf_vertex[1];
  m_vertex_grid[2][2] = qf_vertex[2];
  m_vertex_grid[1][2] = qf_vertex[3];

  const ON_SubDFace* corner_faces[4] = {};
  const ON_SubDVertex* outer_vertex[12] = {};

  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    const unsigned int qfei3 = (qfei+3)%4;

    if ( nullptr == qf_nbr_face[qfei] && nullptr == qf_nbr_face[qfei3])
      continue;

    if (nullptr == sit0.Initialize(center_quad_face, 0, qfei))
      return ON_SUBD_RETURN_ERROR(false);

    if (qf_vertex[qfei] != sit0.CenterVertex())
      return ON_SUBD_RETURN_ERROR(false);

    sit1 = sit0;

    const bool b4EdgedCorner = (4 == qf_vertex[qfei]->m_edge_count && qf_vertex[qfei]->m_face_count >= 3);
    const ON_SubDEdge* e[2] = {};
    const ON_SubDVertex* v[2] = {};
    ON__UINT_PTR eptr;

    for (;;)
    {
      if (nullptr != qf_nbr_face[qfei])
      {
        if (qf_nbr_face[qfei] != sit0.PrevFace(ON_SubDSectorIterator::StopAt::Boundary))
          return ON_SUBD_RETURN_ERROR(false);
        eptr = sit0.CurrentEdgePtr(0).m_ptr;
        e[0] = ON_SUBD_EDGE_POINTER(eptr);
        if (nullptr == e[0])
          return ON_SUBD_RETURN_ERROR(false);
        v[0] = e[0]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
        if (nullptr == v[0])
          return ON_SUBD_RETURN_ERROR(false);
        
        if (b4EdgedCorner)
        {
          ON_SubDSectorIterator::StopAt stop_at
            = bIsDartVertex[qfei]
            ? ON_SubDSectorIterator::StopAt::Boundary
            : ON_SubDSectorIterator::StopAt::AnyCrease
            ;
          corner_faces[qfei] = sit0.PrevFace(stop_at);
          if (nullptr != corner_faces[qfei])
          {
            eptr = sit0.CurrentEdgePtr(0).m_ptr;
            e[1] = ON_SUBD_EDGE_POINTER(eptr);
            if (nullptr == e[1])
              return ON_SUBD_RETURN_ERROR(false);
            v[1] = e[1]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
            if (nullptr == v[1])
              return ON_SUBD_RETURN_ERROR(false);
            break;
          }
        }
      }

      if (nullptr == e[1] && nullptr != qf_nbr_face[qfei3])
      {
        if (qf_nbr_face[qfei3] != sit1.NextFace(ON_SubDSectorIterator::StopAt::Boundary))
          return ON_SUBD_RETURN_ERROR(false);
        eptr = sit1.CurrentEdgePtr(1).m_ptr;
        e[1] = ON_SUBD_EDGE_POINTER(eptr);
        if (nullptr == e[1])
          return ON_SUBD_RETURN_ERROR(false);
        v[1] = e[1]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
        if (nullptr == v[1])
          return ON_SUBD_RETURN_ERROR(false);
        if (b4EdgedCorner && nullptr == corner_faces[qfei])
        {
          ON_SubDSectorIterator::StopAt stop_at
            = bIsDartVertex[qfei3]
            ? ON_SubDSectorIterator::StopAt::Boundary
            : ON_SubDSectorIterator::StopAt::AnyCrease
            ;
          corner_faces[qfei] = sit1.NextFace(stop_at);
          if (nullptr != corner_faces[qfei] && nullptr == e[0] )
          {
            eptr = sit1.CurrentEdgePtr(1).m_ptr;
            e[0] = ON_SUBD_EDGE_POINTER(eptr);
            if (nullptr == e[0])
              return ON_SUBD_RETURN_ERROR(false);
            v[0] = e[0]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
            if (nullptr == v[0])
              return ON_SUBD_RETURN_ERROR(false);
            break;
          }
        }
      }
      break;
    }

    if ( nullptr != corner_faces[qfei] )
      outer_vertex[3 * qfei] = corner_faces[qfei]->QuadOppositeVertex(qf_vertex[qfei]);

    if (nullptr != e[0])
    {
      m_edge_grid[qfei][0] = e[0];
      outer_vertex[3 * qfei + 1] = v[0];
    }

    if (nullptr != e[1])
    {
      m_edge_grid[qfei3][1] = e[1];
      outer_vertex[(3 * qfei + 11) % 12] = v[1];
    }   
  }

  m_face_grid[0][0] = corner_faces[0]; // lower left corner
  m_face_grid[2][0] = corner_faces[1]; // lower right corner
  m_face_grid[2][2] = corner_faces[2]; // upper right corner
  m_face_grid[0][2] = corner_faces[3]; // upper left corner

  m_vertex_grid[0][0] = outer_vertex[0]; // lower left corner
  m_vertex_grid[1][0] = outer_vertex[1];
  m_vertex_grid[2][0] = outer_vertex[2];
  
  m_vertex_grid[3][0] = outer_vertex[3]; // lower right corner
  m_vertex_grid[3][1] = outer_vertex[4];
  m_vertex_grid[3][2] = outer_vertex[5];

  m_vertex_grid[3][3] = outer_vertex[6]; // upper right corner
  m_vertex_grid[2][3] = outer_vertex[7];
  m_vertex_grid[1][3] = outer_vertex[8];
  
  m_vertex_grid[0][3] = outer_vertex[9]; // upper left corner
  m_vertex_grid[0][2] = outer_vertex[10];
  m_vertex_grid[0][1] = outer_vertex[11];

  m_initial_subdivision_level = (unsigned char)(center_quad_face->m_level_zero_face_id > 0 ? center_quad_face->SubdivisionLevel() : 0U);
  m_current_subdivision_level = m_initial_subdivision_level;
  
  SetPatchStatus(0);
  
#if defined(ON_DEBUG)
  IsValid(); // will trigger a break if "this" is not valid
#endif
  
  return true;
}